

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

int __thiscall cmCPackIFWGenerator::RunBinaryCreator(cmCPackIFWGenerator *this,string *ifwTmpFile)

{
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *pcVar2;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ifwCmd;
  string local_438;
  string output;
  ostringstream cmCPackLog_msg_2;
  ostringstream cmCPackLog_msg;
  
  BuildBinaryCreatorCommmand_abi_cxx11_(&ifwCmd,this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Execute: ");
  cmSystemTools::PrintSingleCommand((string *)&cmCPackLog_msg_2,&ifwCmd);
  poVar4 = std::operator<<(poVar4,(string *)&cmCPackLog_msg_2);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_2);
  pcVar1 = (this->super_cmCPackIFWCommon).Generator;
  if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
    pcVar2 = (pcVar1->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x11a,_cmCPackLog_msg_2);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_2);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  retVal = 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"- Generate package");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCPackIFWCommon).Generator;
  if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
    pcVar2 = (pcVar1->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x11d,_cmCPackLog_msg_2);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_2);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  bVar3 = cmSystemTools::RunSingleCommand
                    (&ifwCmd,&output,&output,&retVal,(char *)0x0,
                     (this->super_cmCPackGenerator).GeneratorVerbose,(cmDuration)0x0,Auto);
  if (bVar3 && retVal == 0) {
    iVar5 = 1;
  }
  else {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&cmCPackLog_msg,ifwTmpFile,false,None);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"# Run command: ");
    cmSystemTools::PrintSingleCommand((string *)&cmCPackLog_msg_2,&ifwCmd);
    poVar4 = std::operator<<(poVar4,(string *)&cmCPackLog_msg_2);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# Output:");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,(string *)&output);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_2);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg_2,"Problem running IFW command: ");
    cmSystemTools::PrintSingleCommand(&local_438,&ifwCmd);
    poVar4 = std::operator<<(poVar4,(string *)&local_438);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"Please check \"");
    poVar4 = std::operator<<(poVar4,(string *)ifwTmpFile);
    poVar4 = std::operator<<(poVar4,"\" for errors");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_438);
    pcVar1 = (this->super_cmCPackIFWCommon).Generator;
    if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
      pcVar2 = (pcVar1->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,299,local_438._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_438);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_2);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCPackLog_msg);
    iVar5 = 0;
  }
  std::__cxx11::string::~string((string *)&output);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ifwCmd);
  return iVar5;
}

Assistant:

int cmCPackIFWGenerator::RunBinaryCreator(const std::string& ifwTmpFile)
{
  std::vector<std::string> ifwCmd = this->BuildBinaryCreatorCommmand();
  cmCPackIFWLogger(VERBOSE,
                   "Execute: " << cmSystemTools::PrintSingleCommand(ifwCmd)
                               << std::endl);
  std::string output;
  int retVal = 1;
  cmCPackIFWLogger(OUTPUT, "- Generate package" << std::endl);
  bool res = cmSystemTools::RunSingleCommand(ifwCmd, &output, &output, &retVal,
                                             nullptr, this->GeneratorVerbose,
                                             cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(ifwTmpFile);
    ofs << "# Run command: " << cmSystemTools::PrintSingleCommand(ifwCmd)
        << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackIFWLogger(
      ERROR,
      "Problem running IFW command: "
        << cmSystemTools::PrintSingleCommand(ifwCmd) << std::endl
        << "Please check \"" << ifwTmpFile << "\" for errors" << std::endl);
    return 0;
  }

  return 1;
}